

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O3

void __thiscall QCborStreamWriter::startMap(QCborStreamWriter *this,quint64 count)

{
  QStack<CborEncoder> *this_00;
  _Head_base<0UL,_QCborStreamWriterPrivate_*,_false> _Var1;
  iterator iVar2;
  
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
       .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl;
  this_00 = &(_Var1._M_head_impl)->containerStack;
  QtPrivate::QPodArrayOps<CborEncoder>::emplace<CborEncoder_const&>
            ((QPodArrayOps<CborEncoder> *)this_00,
             *(qsizetype *)((long)&(_Var1._M_head_impl)->containerStack + 0x10),
             &(_Var1._M_head_impl)->encoder);
  QList<CborEncoder>::end(&this_00->super_QList<CborEncoder>);
  iVar2 = QList<CborEncoder>::end(&this_00->super_QList<CborEncoder>);
  if ((long)count < -1) {
    return;
  }
  create_container(iVar2.i + -1,&(_Var1._M_head_impl)->encoder,count,0xa0);
  return;
}

Assistant:

void QCborStreamWriter::startMap(quint64 count)
{
    d->createContainer(cbor_encoder_create_map, count);
}